

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.hpp
# Opt level: O0

void __thiscall helics::Filter::~Filter(Filter *this)

{
  Filter *in_RDI;
  
  ~Filter(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

Filter(Filter&& filt) = default;